

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

int Curl_pgrsUpdate(Curl_easy *data)

{
  _Bool showprogress_00;
  int iVar1;
  curltime cVar2;
  curltime now_00;
  _Bool showprogress;
  curltime now;
  Curl_easy *data_local;
  
  cVar2 = Curl_now();
  now_00._12_4_ = 0;
  now_00.tv_sec = SUB128(cVar2._0_12_,0);
  now_00.tv_usec = SUB124(cVar2._0_12_,8);
  showprogress_00 = progress_calc(data,now_00);
  iVar1 = pgrsupdate(data,showprogress_00);
  return iVar1;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  return pgrsupdate(data, showprogress);
}